

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

void __thiscall mjs::hoisting_visitor::operator()(hoisting_visitor *this,try_statement *s)

{
  statement *psVar1;
  
  accept<mjs::hoisting_visitor>
            ((s->block_)._M_t.
             super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
             super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
             super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl,this);
  psVar1 = (s->catch_)._M_t.
           super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
           super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
           super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl;
  if (psVar1 != (statement *)0x0) {
    accept<mjs::hoisting_visitor>(psVar1,this);
  }
  psVar1 = (s->finally_)._M_t.
           super___uniq_ptr_impl<mjs::statement,_std::default_delete<mjs::statement>_>._M_t.
           super__Tuple_impl<0UL,_mjs::statement_*,_std::default_delete<mjs::statement>_>.
           super__Head_base<0UL,_mjs::statement_*,_false>._M_head_impl;
  if (psVar1 != (statement *)0x0) {
    accept<mjs::hoisting_visitor>(psVar1,this);
    return;
  }
  return;
}

Assistant:

void operator()(const try_statement& s) {
        accept(s.block(), *this);
        if (auto c = s.catch_block()) {
            accept(*c, *this);
        }
        if (auto f = s.finally_block()) {
            accept(*f, *this);
        }
    }